

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O0

void __thiscall Nes_Apu::run_until(Nes_Apu *this,cpu_time_t end_time)

{
  Nes_Square *pNVar1;
  Nes_Square *in_RSI;
  long in_RDI;
  Nes_Triangle *unaff_retaddr;
  cpu_time_t time;
  cpu_time_t in_stack_00000028;
  Nes_Noise *in_stack_00000030;
  int iVar2;
  long time_00;
  
  if ((long)in_RSI < *(long *)(in_RDI + 0x1400)) {
    __assert_fail("( \"unmet requirement\", end_time >= last_time )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Nes_Apu.cpp"
                  ,0x88,"void Nes_Apu::run_until(cpu_time_t)");
  }
  time_00 = in_RDI;
  if (in_RSI != *(Nes_Square **)(in_RDI + 0x1400)) {
    while( true ) {
      pNVar1 = (Nes_Square *)(*(long *)(in_RDI + 0x1400) + (long)*(int *)(in_RDI + 0x141c));
      if ((long)in_RSI < (long)pNVar1) {
        pNVar1 = in_RSI;
      }
      *(int *)(in_RDI + 0x141c) =
           *(int *)(in_RDI + 0x141c) - ((int)pNVar1 - (int)*(undefined8 *)(in_RDI + 0x1400));
      Nes_Square::run((Nes_Square *)in_stack_00000030,in_stack_00000028,(cpu_time_t)this);
      Nes_Square::run((Nes_Square *)in_stack_00000030,in_stack_00000028,(cpu_time_t)this);
      Nes_Triangle::run(unaff_retaddr,time_00,(cpu_time_t)in_RSI);
      Nes_Noise::run(in_stack_00000030,in_stack_00000028,(cpu_time_t)this);
      Nes_Dmc::run((Nes_Dmc *)this,end_time,time);
      *(Nes_Square **)(in_RDI + 0x1400) = pNVar1;
      if (pNVar1 == in_RSI) break;
      *(undefined4 *)(in_RDI + 0x141c) = *(undefined4 *)(in_RDI + 0x1418);
      iVar2 = *(int *)(in_RDI + 0x1420);
      *(int *)(in_RDI + 0x1420) = iVar2 + 1;
      switch(iVar2) {
      case 0:
        if ((*(uint *)(in_RDI + 0x1428) & 0xc0) == 0) {
          *(uchar **)(in_RDI + 0x1410) =
               (pNVar1->super_Nes_Envelope).super_Nes_Osc.regs +
               (long)(*(int *)(in_RDI + 0x1418) << 2) + 1;
          *(undefined1 *)(in_RDI + 0x142c) = 1;
        }
      case 2:
        Nes_Osc::clock_length((Nes_Osc *)(in_RDI + 0x28),0x20);
        iVar2 = (int)((ulong)pNVar1 >> 0x20);
        Nes_Osc::clock_length((Nes_Osc *)(in_RDI + 0x60),0x20);
        Nes_Osc::clock_length((Nes_Osc *)(in_RDI + 0x98),0x20);
        Nes_Osc::clock_length((Nes_Osc *)(in_RDI + 0x628),0x80);
        Nes_Square::clock_sweep(in_RSI,iVar2);
        Nes_Square::clock_sweep(in_RSI,iVar2);
        break;
      case 1:
        *(int *)(in_RDI + 0x141c) = *(int *)(in_RDI + 0x141c) + -2;
        break;
      case 3:
        *(undefined4 *)(in_RDI + 0x1420) = 0;
        if ((*(uint *)(in_RDI + 0x1428) & 0x80) != 0) {
          *(int *)(in_RDI + 0x141c) = *(int *)(in_RDI + 0x1418) + -6 + *(int *)(in_RDI + 0x141c);
        }
      }
      Nes_Triangle::clock_linear_counter((Nes_Triangle *)(in_RDI + 0x628));
      Nes_Envelope::clock_envelope((Nes_Envelope *)(in_RDI + 0x28));
      Nes_Envelope::clock_envelope((Nes_Envelope *)(in_RDI + 0x60));
      Nes_Envelope::clock_envelope((Nes_Envelope *)(in_RDI + 0x98));
    }
  }
  return;
}

Assistant:

void Nes_Apu::run_until( cpu_time_t end_time )
{
	require( end_time >= last_time );
	
	if ( end_time == last_time )
		return;
	
	while ( true )
	{
		// earlier of next frame time or end time
		cpu_time_t time = last_time + frame_delay;
		if ( time > end_time )
			time = end_time;
		frame_delay -= time - last_time;
		
		// run oscs to present
		square1.run( last_time, time );
		square2.run( last_time, time );
		triangle.run( last_time, time );
		noise.run( last_time, time );
		dmc.run( last_time, time );
		last_time = time;
		
		if ( time == end_time )
			break; // no more frames to run
		
		// take frame-specific actions
		frame_delay = frame_period;
		switch ( frame++ )
		{
			case 0:
				if ( !(frame_mode & 0xc0) ) {
		 			next_irq = time + frame_period * 4 + 1;
		 			irq_flag = true;
		 		}
		 		// fall through
		 	case 2:
		 		// clock length and sweep on frames 0 and 2
				square1.clock_length( 0x20 );
				square2.clock_length( 0x20 );
				noise.clock_length( 0x20 );
				triangle.clock_length( 0x80 ); // different bit for halt flag on triangle
				
				square1.clock_sweep( -1 );
				square2.clock_sweep( 0 );
		 		break;
		 	
			case 1:
				// frame 1 is slightly shorter
				frame_delay -= 2;
				break;
			
		 	case 3:
		 		frame = 0;
		 		
		 		// frame 3 is almost twice as long in mode 1
		 		if ( frame_mode & 0x80 )
					frame_delay += frame_period - 6;
				break;
		}
		
		// clock envelopes and linear counter every frame
		triangle.clock_linear_counter();
		square1.clock_envelope();
		square2.clock_envelope();
		noise.clock_envelope();
	}
}